

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void BackOneToken(Lexer *lexer)

{
  LexerTracker *pLVar1;
  char *pcVar2;
  char *token;
  LexerTracker *previous;
  Lexer *lexer_local;
  
  pLVar1 = lexer->previousTrackers + lexer->previousTrackerSpot;
  lexer->previousTrackerSpot = lexer->previousTrackerSpot + -1;
  if (lexer->previousTrackerSpot < 0) {
    lexer->previousTrackerSpot = lexer->totalTrackers + -1;
  }
  (lexer->tracker).col = pLVar1->col;
  (lexer->tracker).currentTokenPosition = pLVar1->currentTokenPosition;
  (lexer->tracker).row = pLVar1->row;
  (lexer->tracker).tokenEnd = pLVar1->tokenEnd;
  (lexer->tracker).tokenStart = pLVar1->tokenStart;
  pcVar2 = GetTokenString(lexer);
  if (lexer->currentTokenString != (char *)0x0) {
    Free(lexer->currentTokenString);
  }
  lexer->currentTokenString = pcVar2;
  return;
}

Assistant:

void BackOneToken(Lexer* lexer){

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	lexer->previousTrackerSpot--;
	if (lexer->previousTrackerSpot < 0) {
		lexer->previousTrackerSpot = lexer->totalTrackers - 1;
	}
	
	lexer->tracker.col = previous->col;
	lexer->tracker.currentTokenPosition = previous->currentTokenPosition;
	lexer->tracker.row = previous->row;
	lexer->tracker.tokenEnd = previous->tokenEnd;
	lexer->tracker.tokenStart = previous->tokenStart;

	char* token = GetTokenString(lexer);

	if (lexer->currentTokenString != NULL) {
		Free(lexer->currentTokenString);
	}

	lexer->currentTokenString = token;
}